

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIOS.cxx
# Opt level: O3

int testIOS(int param_1,char **param_2)

{
  int iVar1;
  size_t sVar2;
  long *plVar3;
  istream *piVar4;
  long lVar5;
  char *pcVar6;
  int x;
  char world [6];
  char hello [6];
  string s;
  ifstream fin;
  istringstream istr;
  ostringstream ostr2;
  stringstream sstr;
  stringstream strstr;
  ostringstream ostr;
  undefined1 auStack_9d8 [4];
  int local_9d4 [2];
  undefined2 local_9cc;
  char local_9c8 [8];
  undefined1 *local_9c0;
  undefined8 local_9b8;
  undefined1 local_9b0;
  undefined7 uStack_9af;
  long *local_9a0;
  long local_998;
  long local_990 [63];
  long local_798 [2];
  string local_788 [104];
  ios_base local_720 [264];
  ostringstream local_618 [112];
  ios_base local_5a8 [264];
  stringstream local_4a0 [16];
  ostream local_490 [112];
  ios_base local_420 [264];
  stringstream local_318 [16];
  char local_308 [112];
  ios_base local_298 [264];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  builtin_strncpy(local_9c8,"hello",6);
  sVar2 = strlen(local_9c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,local_9c8,sVar2);
  std::__cxx11::stringbuf::str();
  iVar1 = std::__cxx11::string::compare((char *)&local_9a0);
  if (local_9a0 != local_990) {
    operator_delete(local_9a0,local_990[0] + 1);
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed to write hello to ostr",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    iVar1 = 1;
    std::ostream::flush();
    goto LAB_00119e6b;
  }
  local_9cc = 100;
  local_9d4[1] = 0x6c726f77;
  std::__cxx11::ostringstream::ostringstream(local_618);
  std::ostream::write((char *)local_618,(long)local_9c8);
  std::ostream::put((char)local_618);
  std::ostream::write((char *)local_618,(long)(local_9d4 + 1));
  std::__cxx11::stringbuf::str();
  lVar5 = local_998;
  if (local_9a0 != local_990) {
    operator_delete(local_9a0,local_990[0] + 1);
  }
  if (lVar5 == 0xb) {
    std::__cxx11::stringstream::stringstream(local_318);
    std::ostream::write(local_308,0x13c580);
    std::__cxx11::stringbuf::str();
    if (local_9a0 != local_990) {
      operator_delete(local_9a0,local_990[0] + 1);
    }
    if (local_998 == 0xb4) {
      local_9a0 = local_990;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a0," 10 20 str ","");
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_798,(string *)&local_9a0,_S_in);
      if (local_9a0 != local_990) {
        operator_delete(local_9a0,local_990[0] + 1);
      }
      local_9b8 = 0;
      local_9b0 = 0;
      local_9c0 = &local_9b0;
      plVar3 = (long *)std::istream::operator>>((istream *)local_798,local_9d4);
      if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
        if (local_9d4[0] != 10) {
          lVar5 = 7;
          pcVar6 = "x != 10";
          goto LAB_00119db2;
        }
        plVar3 = (long *)std::istream::operator>>((istream *)local_798,local_9d4);
        lVar5 = 0x1b;
        if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
          if (local_9d4[0] != 0x14) {
            pcVar6 = "x != 20";
LAB_00119ed7:
            lVar5 = 7;
            goto LAB_00119edc;
          }
          piVar4 = std::operator>>((istream *)local_798,(string *)&local_9c0);
          if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
            lVar5 = 0x1c;
            pcVar6 = "Failed to read str from istr";
            goto LAB_00119edc;
          }
          iVar1 = std::__cxx11::string::compare((char *)&local_9c0);
          if (iVar1 != 0) {
            lVar5 = 10;
            pcVar6 = "s != \"str\"";
            goto LAB_00119edc;
          }
          piVar4 = std::operator>>((istream *)local_798,(string *)&local_9c0);
          if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
            lVar5 = 0x1f;
            pcVar6 = "Able to read past end of stream";
            goto LAB_00119edc;
          }
          std::ios::clear((int)auStack_9d8 + (int)*(undefined8 *)(local_798[0] + -0x18) + 0x240);
          std::ios::clear((int)auStack_9d8 + (int)*(undefined8 *)(local_798[0] + -0x18) + 0x240);
          local_9a0 = local_990;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a0,"30","");
          std::__cxx11::stringbuf::str(local_788);
          if (local_9a0 != local_990) {
            operator_delete(local_9a0,local_990[0] + 1);
          }
          plVar3 = (long *)std::istream::operator>>((istream *)local_798,local_9d4);
          if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
            pcVar6 = "Failed to read 30 from istr";
            goto LAB_00119edc;
          }
          if (local_9d4[0] != 0x1e) {
            pcVar6 = "x != 30";
            goto LAB_00119ed7;
          }
          std::__cxx11::stringstream::stringstream(local_4a0);
          std::__ostream_insert<char,std::char_traits<char>>(local_490,"40 str2",7);
          plVar3 = (long *)std::istream::operator>>((istream *)local_4a0,local_9d4);
          if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
            if (local_9d4[0] != 0x28) {
              lVar5 = 7;
              pcVar6 = "x != 40";
              goto LAB_0011a0b5;
            }
            piVar4 = std::operator>>((istream *)local_4a0,(string *)&local_9c0);
            if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
              lVar5 = 0x1d;
              pcVar6 = "Failed to read str2 from sstr";
              goto LAB_0011a0b5;
            }
            iVar1 = std::__cxx11::string::compare((char *)&local_9c0);
            if (iVar1 != 0) {
              lVar5 = 0xb;
              pcVar6 = "s != \"str2\"";
              goto LAB_0011a0b5;
            }
            if (local_9d4[0] == 0x3039) {
              std::ifstream::ifstream(&local_9a0,"/does_not_exist",_S_in|_S_bin);
              std::ifstream::~ifstream(&local_9a0);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"IOS tests passed",0x10);
            iVar1 = 0;
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
          else {
            lVar5 = 0x1b;
            pcVar6 = "Failed to read 40 from sstr";
LAB_0011a0b5:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
            iVar1 = 1;
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          }
          std::__cxx11::stringstream::~stringstream(local_4a0);
          std::ios_base::~ios_base(local_420);
        }
        else {
          pcVar6 = "Failed to read 20 from istr";
LAB_00119edc:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
          iVar1 = 1;
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        }
      }
      else {
        lVar5 = 0x1b;
        pcVar6 = "Failed to read 10 from istr";
LAB_00119db2:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
        std::ostream::put('\x10');
        iVar1 = 1;
        std::ostream::flush();
      }
      if (local_9c0 != &local_9b0) {
        operator_delete(local_9c0,CONCAT71(uStack_9af,local_9b0) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_798);
      std::ios_base::~ios_base(local_720);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"failed to write array to strstr",0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      iVar1 = 1;
      std::ostream::flush();
    }
    std::__cxx11::stringstream::~stringstream(local_318);
    std::ios_base::~ios_base(local_298);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed to write hello to ostr2",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    iVar1 = 1;
    std::ostream::flush();
  }
  std::__cxx11::ostringstream::~ostringstream(local_618);
  std::ios_base::~ios_base(local_5a8);
LAB_00119e6b:
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return iVar1;
}

Assistant:

int testIOS(int, char* [])
{
  std::ostringstream ostr;
  const char hello[] = "hello";
  ostr << hello;
  if (ostr.str() != hello) {
    std::cerr << "failed to write hello to ostr" << std::endl;
    return 1;
  }
  const char world[] = "world";
  std::ostringstream ostr2;
  ostr2.write(hello, strlen(hello)); /* I could do sizeof */
  ostr2.put('\0');
  ostr2.write(world, strlen(world));
  if (ostr2.str().size() != strlen(hello) + 1 + strlen(world)) {
    std::cerr << "failed to write hello to ostr2" << std::endl;
    return 1;
  }
  static const unsigned char array[] = {
    0xff, 0x4f, 0xff, 0x51, 0x00, 0x29, 0x00, 0x00, 0x00, 0x00, 0x00, 0x30,
    0x00, 0x00, 0x00, 0x3e, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
    0x00, 0x00, 0x00, 0x30, 0x00, 0x00, 0x00, 0x3e, 0x00, 0x00, 0x00, 0x00,
    0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x07, 0x01, 0x01, 0xff, 0x52, 0x00,
    0x0c, 0x00, 0x00, 0x00, 0x01, 0x00, 0x05, 0x04, 0x04, 0x00, 0x01, 0xff,
    0x5c, 0x00, 0x13, 0x40, 0x40, 0x48, 0x48, 0x50, 0x48, 0x48, 0x50, 0x48,
    0x48, 0x50, 0x48, 0x48, 0x50, 0x48, 0x48, 0x50, 0xff, 0x64, 0x00, 0x2c,
    0x00, 0x00, 0x43, 0x72, 0x65, 0x61, 0x74, 0x65, 0x64, 0x20, 0x62, 0x79,
    0x20, 0x49, 0x54, 0x4b, 0x2f, 0x47, 0x44, 0x43, 0x4d, 0x2f, 0x4f, 0x70,
    0x65, 0x6e, 0x4a, 0x50, 0x45, 0x47, 0x20, 0x76, 0x65, 0x72, 0x73, 0x69,
    0x6f, 0x6e, 0x20, 0x31, 0x2e, 0x30, 0xff, 0x90, 0x00, 0x0a, 0x00, 0x00,
    0x00, 0x00, 0x06, 0x2c, 0x00, 0x01, 0xff, 0x93, 0xcf, 0xb0, 0x18, 0x08,
    0x7f, 0xc6, 0x99, 0xbf, 0xff, 0xc0, 0xf8, 0xc1, 0xc1, 0xf3, 0x05, 0x81,
    0xf2, 0x83, 0x0a, 0xa5, 0xff, 0x10, 0x90, 0xbf, 0x2f, 0xff, 0x04, 0xa8,
    0x7f, 0xc0, 0xf8, 0xc4, 0xc1, 0xf3, 0x09, 0x81, 0xf3, 0x0c, 0x19, 0x34
  };
  const size_t narray = sizeof(array); // 180
  std::stringstream strstr;
  strstr.write((char*)array, narray);
  // strstr.seekp( narray / 2 ); // set position of put pointer in mid string
  if (strstr.str().size() != narray) {
    std::cerr << "failed to write array to strstr" << std::endl;
    return 1;
  }

  std::istringstream istr(" 10 20 str ");
  std::string s;
  int x;
  if (istr >> x) {
    if (x != 10) {
      std::cerr << "x != 10" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read 10 from istr" << std::endl;
    return 1;
  }
  if (istr >> x) {
    if (x != 20) {
      std::cerr << "x != 20" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read 20 from istr" << std::endl;
    return 1;
  }
  if (istr >> s) {
    if (s != "str") {
      std::cerr << "s != \"str\"" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read str from istr" << std::endl;
    return 1;
  }
  if (istr >> s) {
    std::cerr << "Able to read past end of stream" << std::endl;
    return 1;
  } else {
    // Clear the failure.
    istr.clear(istr.rdstate() & ~std::ios::eofbit);
    istr.clear(istr.rdstate() & ~std::ios::failbit);
  }
  istr.str("30");
  if (istr >> x) {
    if (x != 30) {
      std::cerr << "x != 30" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read 30 from istr" << std::endl;
    return 1;
  }

  std::stringstream sstr;
  sstr << "40 str2";
  if (sstr >> x) {
    if (x != 40) {
      std::cerr << "x != 40" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read 40 from sstr" << std::endl;
    return 1;
  }
  if (sstr >> s) {
    if (s != "str2") {
      std::cerr << "s != \"str2\"" << std::endl;
      return 1;
    }
  } else {
    std::cerr << "Failed to read str2 from sstr" << std::endl;
    return 1;
  }

  // Just try to compile this.
  if (x == 12345) {
    std::ifstream fin("/does_not_exist", std::ios::in | std::ios::binary);
  }

  std::cout << "IOS tests passed" << std::endl;
  return 0;
}